

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

int write_central_dir(FILE *zip,file_sorted_t *filep)

{
  file_entry_t *pfVar1;
  char *__s;
  size_t sVar2;
  undefined4 local_50;
  undefined2 local_4c;
  undefined2 local_4a;
  short local_48;
  short local_46;
  short local_44;
  short local_42;
  uint local_40;
  uint local_3c;
  uint local_38;
  undefined2 local_34;
  undefined8 local_32;
  undefined4 local_2a;
  uint local_26;
  
  pfVar1 = filep->file;
  local_50 = 0x2014b50;
  local_4c = 0x14;
  local_46 = pfVar1->method;
  local_4a = 0x14;
  local_48 = (ushort)(local_46 == 8) * 2;
  local_44 = pfVar1->time;
  local_42 = pfVar1->date;
  local_40 = pfVar1->crc32;
  local_3c = pfVar1->compressed_size;
  local_38 = pfVar1->uncompressed_size;
  sVar2 = strlen(filep->path_in_zip);
  local_34 = (undefined2)sVar2;
  local_32 = 0;
  local_2a = 0;
  local_26 = pfVar1->zip_offset;
  sVar2 = fwrite(&local_50,0x2e,1,(FILE *)zip);
  if (sVar2 == 1) {
    __s = filep->path_in_zip;
    sVar2 = strlen(__s);
    sVar2 = fwrite(__s,sVar2,1,(FILE *)zip);
    if (sVar2 == 1) {
      return 0;
    }
  }
  write_central_dir_cold_1();
  return 1;
}

Assistant:

int write_central_dir(FILE *zip, file_sorted_t *filep)
{
	CentralDirectoryEntry dir;
	file_entry_t *file;

	file = filep->file;
	dir.Magic = ZIP_CENTRALFILE;
	dir.VersionMadeBy[0] = 20;
	dir.VersionMadeBy[1] = 0;
	dir.VersionToExtract[0] = method_to_version(file->method);
	dir.VersionToExtract[1] = 0;
	dir.Flags = file->method == METHOD_DEFLATE ? LittleShort(2) : 0;
	dir.Method = LittleShort(file->method);
	dir.ModTime = file->time;
	dir.ModDate = file->date;
	dir.CRC32 = file->crc32;
	dir.CompressedSize = LittleLong(file->compressed_size);
	dir.UncompressedSize = LittleLong(file->uncompressed_size);
	dir.NameLength = LittleShort((unsigned short)strlen(filep->path_in_zip));
	dir.ExtraLength = 0;
	dir.CommentLength = 0;
	dir.StartingDiskNumber = 0;
	dir.InternalAttributes = 0;
	dir.ExternalAttributes = 0;
	dir.LocalHeaderOffset = LittleLong(file->zip_offset);

	if (fwrite(&dir, sizeof(dir), 1, zip) != 1 ||
		fwrite(filep->path_in_zip, strlen(filep->path_in_zip), 1, zip) != 1)
	{
		fprintf(stderr, "Error writing central directory header for %s: %s\n", file->path, strerror(errno));
		return 1;
	}
	return 0;
}